

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint32_t helper_float_round_w_s_mipsel(CPUMIPSState_conflict4 *env,uint32_t fst0)

{
  uint32_t uVar1;
  uintptr_t unaff_retaddr;
  
  (env->active_fpu).fp_status.float_rounding_mode = '\0';
  uVar1 = float32_to_int32_mipsel(fst0,&(env->active_fpu).fp_status);
  (env->active_fpu).fp_status.float_rounding_mode =
       (char)ieee_rm_mipsel[(env->active_fpu).fcr31 & 3];
  if (((env->active_fpu).fp_status.float_exception_flags & 9) != 0) {
    uVar1 = 0x7fffffff;
  }
  update_fcr31(env,unaff_retaddr);
  return uVar1;
}

Assistant:

uint32_t helper_float_round_w_s(CPUMIPSState *env, uint32_t fst0)
{
    uint32_t wt2;

    set_float_rounding_mode(float_round_nearest_even,
                            &env->active_fpu.fp_status);
    wt2 = float32_to_int32(fst0, &env->active_fpu.fp_status);
    restore_rounding_mode(env);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
        & (float_flag_invalid | float_flag_overflow)) {
        wt2 = FP_TO_INT32_OVERFLOW;
    }
    update_fcr31(env, GETPC());
    return wt2;
}